

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemotwonorm.cc
# Opt level: O3

double lecturedemo::l2normByMeshFunction
                 (shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *fe_space,VectorXd *uvec)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>_>
  __x;
  PredicateTrue local_91;
  double local_90;
  Mesh *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  MeshFunctionFE<double,_double> local_78;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
  local_40;
  
  peVar1 = (fe_space->
           super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (fe_space->
           super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)uvec);
  local_78.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = local_58.m_data;
  local_78.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = local_58.m_rows;
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_78.fe_space_.
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &peVar1->super_ScalarFESpace<double>;
  local_78.fe_space_.
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (**(((fe_space->
       super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->super_ScalarFESpace<double>)._vptr_ScalarFESpace)(&local_88);
  lf::mesh::utils::squaredNorm<lf::fe::MeshFunctionFE<double,_double>_>(&local_40,&local_78);
  __x = lf::fe::
        IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>,_lf::base::PredicateTrue>
                  (local_88,&local_40,2,&local_91,0);
  if (__x < 0.0) {
    local_90 = sqrt(__x);
  }
  else {
    local_90 = SQRT(__x);
  }
  free(local_40.mf_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  if (local_40.mf_.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.mf_.fe_space_.
               super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  free(local_78.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_data);
  if (local_78.fe_space_.
      super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.fe_space_.
               super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return local_90;
}

Assistant:

double l2normByMeshFunction(
    const std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> &fe_space,
    const Eigen::VectorXd &uvec) {
  // Compute norms of finite element function by means of numerical quadrature
  // which is exact for piecewise quadratic polynomials (degree of exactness 2)
  auto mf_fe = lf::fe::MeshFunctionFE<double, double>(fe_space, uvec);
  return std::sqrt(lf::fe::IntegrateMeshFunction(
      *fe_space->Mesh(), lf::mesh::utils::squaredNorm(mf_fe), 2));
}